

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::MicroStringTest_MemoryUsageComparison_Test::TestBody
          (MicroStringTest_MemoryUsageComparison_Test *this)

{
  long *plVar1;
  AssertHelperData *pAVar2;
  char *pcVar3;
  char (*args_3) [6];
  size_t size;
  ulong uVar4;
  string_view data;
  string_view value;
  int64_t arena_str_used;
  int64_t micro_str_used;
  int64_t this_arena_str_used;
  int64_t this_micro_str_used;
  size_t size_min;
  int64_t diff;
  ArenaStringPtr arena_str;
  string input;
  MicroString micro_str;
  Arena arena;
  undefined1 local_150 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  size_t local_140;
  size_t local_138;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_130;
  size_t local_128;
  size_t local_120;
  unsigned_long local_118;
  AssertHelper local_110;
  TaggedStringPtr local_108;
  long *local_100;
  ulong local_f8;
  long local_f0 [2];
  MicroString local_e0;
  ThreadSafeArena local_d8;
  
  ThreadSafeArena::ThreadSafeArena(&local_d8);
  local_e0.rep_ = (void *)0x0;
  local_108.ptr_ = &fixed_address_empty_string;
  local_100 = local_f0;
  std::__cxx11::string::_M_construct((ulong)&local_100,-0x38);
  local_118 = 0;
  local_138 = 0;
  local_140 = 0;
  if (1 < local_f8) {
    uVar4 = 1;
    do {
      plVar1 = local_100;
      data._M_str = (char *)local_100;
      data._M_len = uVar4;
      MicroString::SetImpl(&local_e0,data,(Arena *)&local_d8,7);
      value._M_str = (char *)plVar1;
      value._M_len = uVar4;
      ArenaStringPtr::Set((ArenaStringPtr *)&local_108,value,(Arena *)&local_d8);
      local_120 = MicroString::SpaceUsedExcludingSelfLong(&local_e0);
      if (((ulong)local_108.ptr_ & 3) == 0) {
        local_128 = 0;
      }
      else {
        local_128 = StringSpaceUsedExcludingSelfLong
                              ((string *)((ulong)local_108.ptr_ & 0xfffffffffffffffc));
        local_128 = local_128 + 0x20;
      }
      testing::internal::CmpHelperLE<long,long>
                ((internal *)local_150,"this_micro_str_used","this_arena_str_used",
                 (long *)&local_120,(long *)&local_128);
      if (local_150[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_130);
        pcVar3 = anon_var_dwarf_a22956 + 5;
        if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = (local_148->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_110,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string_test.cc"
                   ,0x427,pcVar3);
        testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_130);
        testing::internal::AssertHelper::~AssertHelper(&local_110);
        if (local_130._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_130._M_head_impl + 8))();
        }
      }
      if (local_148 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_148,local_148);
      }
      pAVar2 = (AssertHelperData *)(local_138 - local_140);
      if ((AssertHelperData *)(local_120 - local_128) != pAVar2) {
        local_130._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar4 - 1);
        local_150 = (undefined1  [8])0x1147513;
        pcVar3 = "regrs";
        if ((long)pAVar2 < 0) {
          pcVar3 = "saves";
        }
        local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x54;
        if (local_138 == local_140) {
          pcVar3 = "same ";
        }
        local_110.data_ = pAVar2;
        absl::lts_20250127::PrintF<unsigned_long,_unsigned_long,_long,_char[6],_long,_long>
                  ((FormatSpec<unsigned_long,_unsigned_long,_long,_char[6],_long,_long> *)local_150,
                   &local_118,(unsigned_long *)&local_130,(long *)&local_110,(char (*) [6])pcVar3,
                   (long *)&local_138,(long *)&local_140);
        local_138 = local_120;
        local_140 = local_128;
        local_118 = uVar4;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < local_f8);
  }
  local_110.data_ = (AssertHelperData *)(local_138 - local_140);
  local_150 = (undefined1  [8])0x1147513;
  pcVar3 = "regrs";
  if ((long)local_110.data_ < 0) {
    pcVar3 = "saves";
  }
  local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x54;
  args_3 = (char (*) [6])"same ";
  if (local_110.data_ != (AssertHelperData *)0x0) {
    args_3 = (char (*) [6])pcVar3;
  }
  absl::lts_20250127::PrintF<unsigned_long,_unsigned_long,_long,_char[6],_long,_long>
            ((FormatSpec<unsigned_long,_unsigned_long,_long,_char[6],_long,_long> *)local_150,
             &local_118,(unsigned_long *)&local_130,(long *)&local_110,args_3,(long *)&local_138,
             (long *)&local_140);
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  ThreadSafeArena::~ThreadSafeArena(&local_d8);
  return;
}

Assistant:

TEST(MicroStringTest, MemoryUsageComparison) {
  Arena arena;
  MicroString micro_str;
  ArenaStringPtr arena_str;
  arena_str.InitDefault();

  const std::string input(200, 'x');

  size_t size_min = 0;
  int64_t micro_str_used = 0;
  int64_t arena_str_used = 0;

  const auto print_range = [&](size_t size_max) {
    int64_t diff = micro_str_used - arena_str_used;
    absl::PrintF(
        "[%3d, %3d] MicroString-ArenaStringPtr=%3d (%s) MicroUsed=%3d "
        "ArenaStringPtrUsed=%3d\n",
        size_min, size_max, diff,
        diff == 0  ? "same "
        : diff < 0 ? "saves"
                   : "regrs",
        micro_str_used, arena_str_used);
  };
  for (size_t i = 1; i < input.size(); ++i) {
    absl::string_view this_input(input.data(), i);
    micro_str.Set(this_input, &arena);
    arena_str.Set(this_input, &arena);

    int64_t this_micro_str_used = micro_str.SpaceUsedExcludingSelfLong();
    int64_t this_arena_str_used = SpaceUsedExcludingSelfLong(arena_str);
    // We expect to always use the same or less memory.
    if (sizeof(void*) >= 8) {
      EXPECT_LE(this_micro_str_used, this_arena_str_used);
    } else {
      // Except that in 32-bit platforms we have heap alignment to 4 bytes, but
      // arena alignment is always 8. Take that fact into account by rounding up
      // the ArenaStringPtr use.
      EXPECT_LE(this_micro_str_used,
                ArenaAlignDefault::Ceil(this_arena_str_used));
    }

    int64_t diff = micro_str_used - arena_str_used;
    int64_t this_diff = this_micro_str_used - this_arena_str_used;

    if (this_diff != diff) {
      print_range(i - 1);
      size_min = i;
      micro_str_used = this_micro_str_used;
      arena_str_used = this_arena_str_used;
    }
  }
  print_range(input.size());
}